

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O2

void simpleMinimal(word *x,word *pAux,word *minimal,permInfo *pi,int nVars)

{
  ulong uVar1;
  ulong uVar2;
  
  Kit_TruthCopy_64bit(pAux,x,nVars);
  Kit_TruthNot_64bit(x,nVars);
  minWord(x,pAux,minimal,nVars);
  for (uVar2 = (ulong)(uint)pi->totalSwaps; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[uVar2 - 1]);
    Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[uVar2 - 1]);
    minWord3(x,pAux,minimal,nVars);
  }
  uVar2 = (ulong)(uint)pi->totalFlips;
  while (0 < (int)uVar2) {
    uVar2 = uVar2 - 1;
    Kit_TruthSwapAdjacentVars_64bit(x,nVars,0);
    Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,0);
    Kit_TruthChangePhase_64bit(x,nVars,pi->flipArray[uVar2]);
    Kit_TruthChangePhase_64bit(pAux,nVars,pi->flipArray[uVar2]);
    minWord3(x,pAux,minimal,nVars);
    for (uVar1 = (ulong)(uint)pi->totalSwaps; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[uVar1 - 1]);
      Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[uVar1 - 1]);
      minWord3(x,pAux,minimal,nVars);
    }
  }
  Kit_TruthCopy_64bit(x,minimal,nVars);
  return;
}

Assistant:

void simpleMinimal(word* x, word* pAux,word* minimal, permInfo* pi, int nVars)
{
    int i,j=0;
    Kit_TruthCopy_64bit( pAux, x, nVars );
    Kit_TruthNot_64bit( x, nVars );
    
    minWord(x, pAux, minimal, nVars);
    
    for(i=pi->totalSwaps-1;i>=0;i--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
        minWord3(x, pAux, minimal, nVars);
    }
    for(j=pi->totalFlips-1;j>=0;j--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, 0);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, 0);
        Kit_TruthChangePhase_64bit(x, nVars, pi->flipArray[j]);
        Kit_TruthChangePhase_64bit(pAux, nVars, pi->flipArray[j]);
        minWord3(x, pAux, minimal, nVars);
        for(i=pi->totalSwaps-1;i>=0;i--)
        {
            Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
            Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
            minWord3(x, pAux, minimal, nVars);
        }
    } 
    Kit_TruthCopy_64bit( x, minimal, nVars );    
}